

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest.cc
# Opt level: O2

bool SumFile(string *out_hex,EVP_MD *md,Source *source)

{
  byte bVar1;
  FILE *__stream;
  bool bVar2;
  int iVar3;
  __uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true> __s;
  int *piVar4;
  char *pcVar5;
  ulong uVar6;
  ScopedFD fd;
  char *pcVar7;
  byte *md_00;
  size_t sStack_150;
  ScopedFD scoped_fd;
  __array buf;
  uint digest_len;
  ScopedEVP_MD_CTX ctx;
  EVP_PKEY_CTX *local_108 [2];
  EVP_PKEY_CTX local_f8 [16];
  char hex_digest [128];
  uint8_t digest [64];
  
  scoped_fd.fd_ = -1;
  fd.fd_ = 0;
  if (source->is_stdin_ == false) {
    OpenFile((string *)hex_digest);
    ScopedFD::reset(&scoped_fd);
    scoped_fd.fd_._0_1_ = hex_digest[0];
    scoped_fd.fd_._1_1_ = hex_digest[1];
    scoped_fd.fd_._2_1_ = hex_digest[2];
    scoped_fd.fd_._3_1_ = hex_digest[3];
    hex_digest[0] = -1;
    hex_digest[1] = -1;
    hex_digest[2] = -1;
    hex_digest[3] = -1;
    ScopedFD::~ScopedFD((ScopedFD *)hex_digest);
    fd = scoped_fd;
    if (scoped_fd.fd_ < 0) {
      bVar2 = false;
      goto LAB_00123435;
    }
  }
  __s.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)operator_new__(0x2000)
  ;
  memset((void *)__s.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                 _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                 .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0,0x2000);
  buf._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
       (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
       __s.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  EVP_MD_CTX_init((EVP_MD_CTX *)&ctx);
  iVar3 = EVP_DigestInit_ex((EVP_MD_CTX *)&ctx,(EVP_MD *)md,(ENGINE *)0x0);
  if (iVar3 == 0) {
    pcVar7 = "Failed to initialize EVP_MD_CTX.\n";
    sStack_150 = 0x21;
  }
  else {
    do {
      bVar2 = ReadFromFD(fd.fd_,(size_t *)hex_digest,
                         (void *)buf._M_t.
                                 super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                 .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0x2000)
      ;
      __stream = _stderr;
      if (!bVar2) {
        if (source->is_stdin_ == false) {
          pcVar7 = (source->filename_)._M_dataplus._M_p;
        }
        else {
          pcVar7 = "standard input";
        }
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        fprintf(__stream,"Failed to read from %s: %s\n",pcVar7,pcVar5);
        goto LAB_001234d4;
      }
      if (CONCAT44(hex_digest._4_4_,hex_digest._0_4_) == 0) {
        md_00 = digest;
        iVar3 = EVP_DigestFinal_ex((EVP_MD_CTX *)&ctx,md_00,&digest_len);
        bVar2 = iVar3 != 0;
        if (iVar3 == 0) {
          fwrite("Failed to finish hash.\n",0x17,1,_stderr);
        }
        else {
          for (uVar6 = 0; (ulong)digest_len * 2 != uVar6; uVar6 = uVar6 + 2) {
            bVar1 = *md_00;
            hex_digest[uVar6 & 0xffffffff] = "0123456789abcdef"[bVar1 >> 4];
            hex_digest[(int)uVar6 + 1] = "0123456789abcdef"[bVar1 & 0xf];
            md_00 = md_00 + 1;
          }
          local_108[0] = local_f8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_108,hex_digest,hex_digest + digest_len * 2);
          std::__cxx11::string::operator=((string *)out_hex,(string *)local_108);
          std::__cxx11::string::~string((string *)local_108);
        }
        goto LAB_00123421;
      }
      iVar3 = EVP_DigestUpdate((EVP_MD_CTX *)&ctx,
                               (void *)buf._M_t.
                                       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                       .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,
                               CONCAT44(hex_digest._4_4_,hex_digest._0_4_));
    } while (iVar3 != 0);
    pcVar7 = "Failed to update hash.\n";
    sStack_150 = 0x17;
  }
  fwrite(pcVar7,sStack_150,1,_stderr);
LAB_001234d4:
  bVar2 = false;
LAB_00123421:
  bssl::internal::
  StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
  ::~StackAllocatedMovable(&ctx);
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr(&buf);
LAB_00123435:
  ScopedFD::~ScopedFD(&scoped_fd);
  return bVar2;
}

Assistant:

static bool SumFile(std::string *out_hex, const EVP_MD *md,
                    const Source &source) {
  ScopedFD scoped_fd;
  int fd;

  if (source.is_stdin()) {
    fd = 0;
  } else {
    scoped_fd = OpenFile(source.filename());
    if (!scoped_fd) {
      return false;
    }
    fd = scoped_fd.get();
  }

  static const size_t kBufSize = 8192;
  auto buf = std::make_unique<uint8_t[]>(kBufSize);

  bssl::ScopedEVP_MD_CTX ctx;
  if (!EVP_DigestInit_ex(ctx.get(), md, NULL)) {
    fprintf(stderr, "Failed to initialize EVP_MD_CTX.\n");
    return false;
  }

  for (;;) {
    size_t n;
    if (!ReadFromFD(fd, &n, buf.get(), kBufSize)) {
      fprintf(stderr, "Failed to read from %s: %s\n",
              source.is_stdin() ? kStdinName : source.filename().c_str(),
              strerror(errno));
      return false;
    }

    if (n == 0) {
      break;
    }

    if (!EVP_DigestUpdate(ctx.get(), buf.get(), n)) {
      fprintf(stderr, "Failed to update hash.\n");
      return false;
    }
  }

  uint8_t digest[EVP_MAX_MD_SIZE];
  unsigned digest_len;
  if (!EVP_DigestFinal_ex(ctx.get(), digest, &digest_len)) {
    fprintf(stderr, "Failed to finish hash.\n");
    return false;
  }

  char hex_digest[EVP_MAX_MD_SIZE * 2];
  static const char kHextable[] = "0123456789abcdef";
  for (unsigned i = 0; i < digest_len; i++) {
    const uint8_t b = digest[i];
    hex_digest[i * 2] = kHextable[b >> 4];
    hex_digest[i * 2 + 1] = kHextable[b & 0xf];
  }
  *out_hex = std::string(hex_digest, digest_len * 2);

  return true;
}